

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_component_argument_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  uint32_t __val;
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __val = Compiler::evaluate_constant_u32((Compiler *)this,id);
  switch(__val) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "component::x";
    pcVar4 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "component::y";
    pcVar4 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "component::z";
    pcVar4 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "component::w";
    pcVar4 = "";
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::to_string(&local_88,__val);
    ::std::operator+(&local_68,"The value (",&local_88);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_68);
    local_e8._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar2) {
      local_e8.field_2._M_allocated_capacity = *psVar2;
      local_e8.field_2._8_8_ = plVar1[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar2;
    }
    local_e8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::__cxx11::to_string(&local_a8,id);
    ::std::operator+(&local_48,&local_e8,&local_a8);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_48);
    local_c8 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_c8 == plVar3) {
      local_b8 = *plVar3;
      lStack_b0 = plVar1[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar3;
    }
    local_c0 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::runtime_error::runtime_error(this_00,(string *)&local_c8);
    *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_component_argument(uint32_t id)
{
	uint32_t component_index = evaluate_constant_u32(id);
	switch (component_index)
	{
	case 0:
		return "component::x";
	case 1:
		return "component::y";
	case 2:
		return "component::z";
	case 3:
		return "component::w";

	default:
		SPIRV_CROSS_THROW("The value (" + to_string(component_index) + ") of OpConstant ID " + to_string(id) +
		                  " is not a valid Component index, which must be one of 0, 1, 2, or 3.");
		return "component::x";
	}
}